

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_wrapper.cpp
# Opt level: O0

void __thiscall daw::curl_wrapper::curl_wrapper(curl_wrapper *this)

{
  curl_wrapper *this_local;
  
  std::make_unique<daw::curl_wrapper::impl_t>();
  return;
}

Assistant:

curl_wrapper::curl_wrapper( )
	  : m_impl( std::make_unique<impl_t>( ) ) {}